

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

ProcessorInstance * __thiscall
soul::ResolutionPass::ProcessorInstanceResolver::visit
          (ProcessorInstanceResolver *this,ProcessorInstance *instance)

{
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  *params;
  size_t *psVar1;
  function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__x;
  long *plVar2;
  pointer ppVar3;
  Allocator *__args;
  string_view firstReplacement;
  bool bVar4;
  Expression *pEVar5;
  ProcessorBase *pPVar6;
  Graph *g;
  UnqualifiedName *pUVar7;
  string *psVar8;
  Namespace *__args_1;
  ModuleBase *object;
  ProcessorRef *pPVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar10;
  string_view firstToReplace;
  size_t in_stack_fffffffffffffce8;
  pointer ppVar11;
  pool_ptr<soul::AST::ProcessorBase> p;
  pool_ref<soul::AST::ProcessorBase> target;
  _Any_data local_2f8 [2];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_2d8;
  Graph *local_2a0;
  Scope local_298;
  function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  oldCloneFn;
  string nameRoot;
  string local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  pool_ptr<soul::AST::Expression> local_170;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs;
  CompileMessage local_130;
  CompileMessage local_f8;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_c0;
  CompileMessage local_68;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,instance);
  pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&instance->targetProcessor);
  (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[6])(&p,pEVar5);
  if (p.object == (ProcessorBase *)0x0) {
    if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors ==
        false) {
      pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&instance->targetProcessor);
      Errors::expectedProcessorName<>();
      AST::Context::throwError(&(pEVar5->super_Statement).super_ASTObject.context,&local_68,false);
    }
    psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails;
    *psVar1 = *psVar1 + 1;
  }
  else {
    pPVar6 = pool_ptr<soul::AST::ProcessorBase>::operator->(&p);
    if ((pPVar6->owningInstance).object != instance) {
      local_170.object = (instance->specialisationArgs).object;
      AST::CommaSeparatedList::getAsExpressionList(&specialisationArgs,&local_170);
      pPVar6 = pool_ptr<soul::AST::ProcessorBase>::operator*(&p);
      params = &(pPVar6->super_ModuleBase).specialisationParams;
      target.object = pPVar6;
      bVar4 = ModuleInstanceResolver::validateSpecialisationArgs
                        (&this->super_ModuleInstanceResolver,&specialisationArgs,params,
                         (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor
                         .ignoreErrors);
      lVar10 = 0x28;
      if (bVar4) {
        AST::Scope::findProcessor(&local_298);
        cast<soul::AST::Graph,soul::AST::ProcessorBase>
                  ((soul *)local_2f8[0]._M_pod_data,(pool_ptr<soul::AST::ProcessorBase> *)&local_298
                  );
        g = pool_ptr<soul::AST::Graph>::operator*((pool_ptr<soul::AST::Graph> *)local_2f8);
        SanityCheckPass::RecursiveGraphDetector::check(g,(RecursiveGraphDetector *)0x0);
        if ((instance->implicitInstanceSource).object == (SharedEndpoint *)0x0) {
          pUVar7 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&instance->instanceName);
          AST::UnqualifiedName::getIdentifierPath((IdentifierPath *)&local_c0,pUVar7);
          local_2a0 = g;
          AST::Scope::getMatchingSubModules
                    ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                      *)local_2f8,&(g->super_ProcessorBase).super_ModuleBase.super_Scope,
                     (IdentifierPath *)&local_c0);
          std::
          _Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
          ::~_Vector_base((_Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                           *)local_2f8);
          ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_c0);
          g = local_2a0;
          if (local_2f8[0]._M_unused._M_object != local_2f8[0]._8_8_) {
            AST::ProcessorInstance::getReadableName_abi_cxx11_((string *)local_2f8,instance);
            Errors::alreadyProcessorWithName<std::__cxx11::string>
                      (&local_130,(Errors *)local_2f8[0]._M_pod_data,args);
            AST::Context::throwError(&(instance->super_ASTObject).context,&local_130,false);
          }
        }
        bVar4 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                          (&this->super_ModuleInstanceResolver,&specialisationArgs,params);
        if (bVar4) {
          ppVar3 = (pPVar6->super_ModuleBase).specialisationParams.
                   super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar11 = (pPVar6->super_ModuleBase).specialisationParams.
                    super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((ppVar3 != ppVar11) || ((pPVar6->owningInstance).object != (ProcessorInstance *)0x0))
          {
            psVar8 = Identifier::toString_abi_cxx11_(&(pPVar6->super_ModuleBase).name);
            std::__cxx11::string::string((string *)&nameRoot,(string *)psVar8);
            if (ppVar3 != ppVar11) {
              (*(g->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[0xd])
                        (local_2f8,g);
              IdentifierPath::toString_abi_cxx11_(&local_230,(IdentifierPath *)local_2f8);
              firstReplacement._M_str = (char *)ppVar11;
              firstReplacement._M_len = in_stack_fffffffffffffce8;
              firstToReplace._M_str = (char *)0x1;
              firstToReplace._M_len = (size_t)":";
              choc::text::replace<std::__cxx11::string>
                        (&local_210,(text *)&local_230,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1,
                         firstToReplace,firstReplacement);
              std::operator+(&local_1f0,&local_210,"_");
              pUVar7 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&instance->instanceName);
              AST::UnqualifiedName::toString_abi_cxx11_(&local_250,pUVar7);
              std::operator+(&local_1d0,&local_1f0,&local_250);
              makeSafeIdentifierName(&local_1b0,&local_1d0);
              std::operator+(&local_190,"_for_",&local_1b0);
              TokenisedPathString::join((string *)&oldCloneFn,&nameRoot,&local_190);
              std::__cxx11::string::operator=((string *)&nameRoot,(string *)&oldCloneFn);
              std::__cxx11::string::~string((string *)&oldCloneFn);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::__cxx11::string::~string((string *)&local_1d0);
              std::__cxx11::string::~string((string *)&local_250);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::__cxx11::string::~string((string *)&local_210);
              std::__cxx11::string::~string((string *)&local_230);
              ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                        ((ArrayWithPreallocation<soul::Identifier,_8UL> *)local_2f8);
            }
            __args_1 = AST::ModuleBase::getNamespace(&pPVar6->super_ModuleBase);
            __args = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                     allocator;
            AST::Scope::makeUniqueName
                      ((string *)local_2f8,&(__args_1->super_ModuleBase).super_Scope,&nameRoot);
            object = std::
                     function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     ::operator()(&(pPVar6->super_ModuleBase).createClone,__args,__args_1,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2f8);
            cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&oldCloneFn,object);
            pPVar6 = pool_ptr<soul::AST::ProcessorBase>::operator*
                               ((pool_ptr<soul::AST::ProcessorBase> *)&oldCloneFn);
            target.object = pPVar6;
            std::__cxx11::string::~string((string *)local_2f8[0]._M_pod_data);
            if (ppVar3 != ppVar11) {
              __x = &(pPVar6->super_ModuleBase).createClone;
              std::
              function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&oldCloneFn,__x);
              std::
              function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_2f8,&oldCloneFn);
              ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
              ArrayWithPreallocation(&local_2d8,&specialisationArgs);
              std::
              function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
              ::operator=((function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
                           *)__x,(anon_class_88_2_5590cdb4 *)local_2f8);
              visit(soul::AST::ProcessorInstance&)::
              {lambda(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)#1}::
              ~basic_string((_lambda_soul__AST__Allocator__soul__AST__Namespace__std____cxx11__string_const___1_
                             *)local_2f8[0]._M_pod_data);
              ModuleInstanceResolver::resolveAllSpecialisationArgs
                        (&specialisationArgs,&(pPVar6->super_ModuleBase).specialisationParams);
              std::_Function_base::~_Function_base(&oldCloneFn.super__Function_base);
            }
            std::__cxx11::string::~string((string *)&nameRoot);
          }
          (pPVar6->owningInstance).object = instance;
          (pPVar6->originalBeforeSpecialisation).object = p.object;
          pPVar9 = PoolAllocator::
                   allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::pool_ref<soul::AST::ProcessorBase>&>
                             (&((this->super_ModuleInstanceResolver).
                                super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                              &(instance->super_ASTObject).context,&target);
          (instance->targetProcessor).object = &pPVar9->super_Expression;
          (instance->specialisationArgs).object = (Expression *)0x0;
          lVar10 = 8;
        }
      }
      else if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
               ignoreErrors == false) {
        (*(pPVar6->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xe])(local_2f8,pPVar6);
        Errors::wrongNumArgsForNamespace<soul::IdentifierPath>
                  (&local_f8,(IdentifierPath *)local_2f8);
        AST::Context::throwError(&(instance->super_ASTObject).context,&local_f8,false);
      }
      plVar2 = (long *)((long)&(this->super_ModuleInstanceResolver).
                               super_ErrorIgnoringRewritingASTVisitor.super_RewritingASTVisitor.
                               _vptr_RewritingASTVisitor + lVar10);
      *plVar2 = *plVar2 + 1;
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::clear(&specialisationArgs)
      ;
    }
  }
  return instance;
}

Assistant:

AST::ProcessorInstance& visit (AST::ProcessorInstance& instance) override
        {
            super::visit (instance);

            if (auto p = instance.targetProcessor->getAsProcessor())
            {
                if (p->owningInstance == instance)
                    return instance;

                auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (instance.specialisationArgs);
                auto target = pool_ref<AST::ProcessorBase> (*p);

                if (! validateSpecialisationArgs (specialisationArgs, target->specialisationParams, ignoreErrors))
                {
                    if (ignoreErrors)
                    {
                        ++numFails;
                        return instance;
                    }

                    instance.context.throwError (Errors::wrongNumArgsForNamespace (target->getFullyQualifiedDisplayPath()));
                }

                auto& graph = *cast<AST::Graph> (instance.getParentScope()->findProcessor());
                SanityCheckPass::RecursiveGraphDetector::check (graph);

                if (! instance.isImplicitlyCreated())
                    if (! graph.getMatchingSubModules (instance.instanceName->getIdentifierPath()).empty())
                        instance.context.throwError (Errors::alreadyProcessorWithName (instance.getReadableName()));

                if (! canResolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams))
                {
                    ++numFails;
                    return instance;
                }

                bool requiresSpecialisation = ! target->specialisationParams.empty();

                if (target->owningInstance != nullptr || requiresSpecialisation)
                {
                    auto nameRoot = target->name.toString();

                    if (requiresSpecialisation)
                        nameRoot = TokenisedPathString::join (nameRoot,
                                                              "_for_" + makeSafeIdentifierName (choc::text::replace (graph.getFullyQualifiedPath().toString(), ":", "_")
                                                                  + "_" + instance.instanceName->toString()));
                    auto& ns = target->getNamespace();
                    target = *cast<AST::ProcessorBase> (target->createClone (allocator, ns, ns.makeUniqueName (nameRoot)));

                    if (requiresSpecialisation)
                    {
                        auto oldCloneFn = target->createClone;

                        target->createClone = [=] (AST::Allocator& a, AST::Namespace& parentNS, const std::string& newName) -> AST::ModuleBase&
                        {
                            auto& m = oldCloneFn (a, parentNS, newName);
                            resolveAllSpecialisationArgs (specialisationArgs, m.specialisationParams);
                            return m;
                        };

                        resolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams);
                    }
                }

                target->owningInstance = instance;
                target->originalBeforeSpecialisation = p;
                instance.targetProcessor = allocator.allocate<AST::ProcessorRef> (instance.context, target);
                instance.specialisationArgs = nullptr;
                ++itemsReplaced;
                return instance;
            }

            if (! ignoreErrors)
                instance.targetProcessor->context.throwError (Errors::expectedProcessorName());

            ++numFails;
            return instance;
        }